

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_currencysymbols.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::CurrencySymbols::CurrencySymbols
          (CurrencySymbols *this,CurrencyUnit *currency,Locale *locale,DecimalFormatSymbols *symbols
          ,UErrorCode *status)

{
  CurrencyUnit CStack_48;
  
  CurrencyUnit::CurrencyUnit(&CStack_48,currency);
  CurrencySymbols(this,&CStack_48,locale,status);
  CurrencyUnit::~CurrencyUnit(&CStack_48);
  if (symbols->fIsCustomCurrencySymbol != '\0') {
    UnicodeString::operator=(&this->fCurrencySymbol,(UnicodeString *)&symbols->field_0x208);
  }
  if (symbols->fIsCustomIntlCurrencySymbol != '\0') {
    UnicodeString::operator=(&this->fIntlCurrencySymbol,(UnicodeString *)&symbols->field_0x248);
  }
  return;
}

Assistant:

CurrencySymbols::CurrencySymbols(CurrencyUnit currency, const Locale& locale,
                                 const DecimalFormatSymbols& symbols, UErrorCode& status)
        : CurrencySymbols(currency, locale, status) {
    // If either of the overrides is present, save it in the local UnicodeString.
    if (symbols.isCustomCurrencySymbol()) {
        fCurrencySymbol = symbols.getConstSymbol(DecimalFormatSymbols::kCurrencySymbol);
    }
    if (symbols.isCustomIntlCurrencySymbol()) {
        fIntlCurrencySymbol = symbols.getConstSymbol(DecimalFormatSymbols::kIntlCurrencySymbol);
    }
}